

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O2

double __thiscall
chrono::ChFunction::Compute_sqrmean
          (ChFunction *this,double xmin,double xmax,double sampling_step,int derivate)

{
  int iVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  dVar3 = 0.0;
  iVar1 = 0;
  for (; xmin <= xmax; xmin = xmin + sampling_step) {
    iVar1 = iVar1 + 1;
    dVar2 = xmin;
    (*this->_vptr_ChFunction[10])(this,derivate);
    dVar3 = dVar3 + dVar2 * dVar2;
  }
  auVar4._0_8_ = dVar3 / (double)iVar1;
  auVar4._8_8_ = 0;
  if (0.0 <= auVar4._0_8_) {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    return auVar4._0_8_;
  }
  dVar3 = sqrt(auVar4._0_8_);
  return dVar3;
}

Assistant:

double ChFunction::Compute_sqrmean(double xmin, double xmax, double sampling_step, int derivate) const {
    double mret = 0;
    int numpts = 0;
    for (double mx = xmin; mx <= xmax; mx = mx + sampling_step) {
        numpts++;
        mret += pow(this->Get_y_dN(mx, derivate), 2.);
    }
    return sqrt(mret / ((double)numpts));
}